

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_BrepFace::SetDomain(ON_BrepFace *this,ON_Interval u_dom,ON_Interval v_dom)

{
  ON_Interval *this_00;
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ON_Interval new_interval;
  ON_Interval domain;
  ON_Interval new_interval_00;
  ON_Interval new_interval_01;
  ON_Interval domain_00;
  ON_Interval new_interval_02;
  ON_Interval old_interval;
  ON_Interval old_interval_00;
  ON_Interval old_interval_01;
  ON_Interval old_interval_02;
  ON_Interval domain_01;
  bool bVar2;
  int iVar3;
  ON_Surface *pS;
  ulong uVar4;
  undefined4 extraout_var;
  shared_ptr<const_ON_Mesh> *psVar5;
  ON_Interval *pOVar6;
  double *pdVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  ON_Xform *pOVar11;
  uint uVar12;
  ON_Xform *pOVar13;
  long lVar14;
  byte bVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar16;
  ON_Interval v0_dom;
  ON_Interval u0_dom;
  array<std::shared_ptr<const_ON_Mesh>,_3UL> meshes;
  ON_Xform vx;
  ON_Interval dom1;
  ON_Xform xform;
  ON_Interval local_280;
  ON_Interval local_270;
  ON_Interval local_260;
  ON_Interval local_250;
  double local_240;
  ON_Xform local_238;
  ON_Xform local_1b8;
  ON_Xform local_138;
  ON_Xform local_b0;
  
  local_280.m_t[1] = v_dom.m_t[1];
  local_280.m_t[0] = v_dom.m_t[0];
  dVar16 = u_dom.m_t[1];
  bVar15 = 0;
  local_270.m_t[0] = u_dom.m_t[0];
  if ((((this->m_brep != (ON_Brep *)0x0) &&
       (local_270.m_t[1] = dVar16, bVar2 = ON_Interval::IsIncreasing(&local_270), bVar2)) &&
      (bVar2 = ON_Interval::IsIncreasing(&local_280), bVar2)) &&
     (pS = SurfaceOf(this), pS != (ON_Surface *)0x0)) {
    (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,0);
    local_250.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_250.m_t[1] = dVar16;
    (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,1);
    local_260.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    local_260.m_t[1] = dVar16;
    bVar2 = ON_Interval::operator==(&local_250,&local_270);
    if ((bVar2) && (bVar2 = ON_Interval::operator==(&local_260,&local_280), bVar2)) {
      return true;
    }
    pOVar11 = &ON_Xform::IdentityTransformation;
    pOVar13 = &local_b0;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    pOVar11 = &ON_Xform::IdentityTransformation;
    pOVar13 = &local_238;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    pOVar11 = &ON_Xform::IdentityTransformation;
    pOVar13 = &local_1b8;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    bVar2 = ON_Interval::operator!=(&local_250,&local_270);
    if (((!bVar2) ||
        (old_interval_01.m_t[1] = local_250.m_t[1], old_interval_01.m_t[0] = local_250.m_t[0],
        new_interval_01.m_t[1] = local_270.m_t[1], new_interval_01.m_t[0] = local_270.m_t[0],
        dVar16 = local_250.m_t[1],
        bVar2 = ON_Xform::IntervalChange(&local_238,0,old_interval_01,new_interval_01), bVar2)) &&
       ((bVar2 = ON_Interval::operator!=(&local_260,&local_280), !bVar2 ||
        (old_interval.m_t[1] = local_260.m_t[1], old_interval.m_t[0] = local_260.m_t[0],
        new_interval.m_t[1] = local_280.m_t[1], new_interval.m_t[0] = local_280.m_t[0],
        dVar16 = local_260.m_t[1],
        bVar2 = ON_Xform::IntervalChange(&local_1b8,1,old_interval,new_interval), bVar2)))) {
      ON_Xform::operator*(&local_138,&local_238,&local_1b8);
      pOVar11 = &local_138;
      pOVar13 = &local_b0;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
        pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
      }
      (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x17])(this,1);
      uVar4 = (ulong)(this->m_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                     super_ON_ClassArray<ON_BrepFace>.m_count;
      if (0 < (long)uVar4) {
        piVar9 = &((this->m_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                   super_ON_ClassArray<ON_BrepFace>.m_a)->m_si;
        uVar12 = 0;
        uVar10 = 1;
        do {
          uVar12 = (*piVar9 == this->m_si) + uVar12;
          if (uVar4 <= uVar10) break;
          uVar10 = uVar10 + 1;
          piVar9 = piVar9 + 0x36;
        } while (uVar12 < 2);
        if (1 < uVar12) {
          iVar3 = (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pS);
          pS = (ON_Surface *)CONCAT44(extraout_var,iVar3);
          iVar3 = ON_Brep::AddSurface(this->m_brep,pS);
          this->m_si = iVar3;
          ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pS);
        }
      }
      bVar2 = ON_Interval::operator!=(&local_270,&local_250);
      if ((bVar2) &&
         (domain_00.m_t[1] = local_270.m_t[1], domain_00.m_t[0] = local_270.m_t[0],
         dVar16 = local_270.m_t[1], bVar2 = ON_Surface::SetDomain(pS,0,domain_00), !bVar2)) {
        return false;
      }
      bVar2 = ON_Interval::operator!=(&local_280,&local_260);
      if ((bVar2) &&
         (domain.m_t[1] = local_280.m_t[1], domain.m_t[0] = local_280.m_t[0],
         dVar16 = local_280.m_t[1], bVar2 = ON_Surface::SetDomain(pS,1,domain), !bVar2)) {
        domain_01.m_t[1] = local_250.m_t[1];
        domain_01.m_t[0] = local_250.m_t[0];
        ON_Surface::SetDomain(pS,0,domain_01);
        return false;
      }
      (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,0);
      local_270.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      local_270.m_t[1] = dVar16;
      (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,1);
      local_280.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      pOVar11 = &ON_Xform::IdentityTransformation;
      pOVar13 = &local_238;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
        pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
      }
      pOVar11 = &ON_Xform::IdentityTransformation;
      pOVar13 = &local_1b8;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
        pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
      }
      local_280.m_t[1] = dVar16;
      bVar2 = ON_Interval::operator!=(&local_250,&local_270);
      if (((!bVar2) ||
          (old_interval_02.m_t[1] = local_250.m_t[1], old_interval_02.m_t[0] = local_250.m_t[0],
          new_interval_02.m_t[1] = local_270.m_t[1], new_interval_02.m_t[0] = local_270.m_t[0],
          bVar2 = ON_Xform::IntervalChange(&local_238,0,old_interval_02,new_interval_02), bVar2)) &&
         ((bVar2 = ON_Interval::operator!=(&local_260,&local_280), !bVar2 ||
          (old_interval_00.m_t[1] = local_260.m_t[1], old_interval_00.m_t[0] = local_260.m_t[0],
          new_interval_00.m_t[1] = local_280.m_t[1], new_interval_00.m_t[0] = local_280.m_t[0],
          bVar2 = ON_Xform::IntervalChange(&local_1b8,1,old_interval_00,new_interval_00), bVar2))))
      {
        ON_Xform::operator*(&local_138,&local_238,&local_1b8);
        pOVar11 = &local_138;
        pOVar13 = &local_b0;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          pOVar13->m_xform[0][0] = pOVar11->m_xform[0][0];
          pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar15 * -2 + 1) * 8);
          pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        bVar2 = TransformTrim(this,&local_b0);
        if (bVar2) {
          psVar5 = UniqueMesh(this,analysis_mesh);
          local_238.m_xform[0][0] =
               (double)(psVar5->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
          local_238.m_xform[0][1] =
               (double)(psVar5->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][1])->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][1])->_M_use_count + 1;
            }
          }
          psVar5 = UniqueMesh(this,render_mesh);
          local_238.m_xform[0][2] =
               (double)(psVar5->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
          local_238.m_xform[0][3] =
               (double)(psVar5->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][3] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][3])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][3])->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][3])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][3])->_M_use_count + 1;
            }
          }
          psVar5 = UniqueMesh(this,preview_mesh);
          local_238.m_xform[1][0] =
               (double)(psVar5->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
          local_238.m_xform[1][1] =
               (double)(psVar5->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[1][1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[1][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[1][1])->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[1][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[1][1])->_M_use_count + 1;
            }
          }
          lVar8 = 0;
          do {
            lVar1 = *(long *)((long)local_238.m_xform[0] + lVar8);
            if (lVar1 != 0) {
              lVar14 = 0;
              do {
                pOVar6 = &local_260;
                if (lVar14 == 0) {
                  pOVar6 = &local_250;
                }
                this_00 = (ON_Interval *)(lVar1 + 0x240 + lVar14);
                local_1b8.m_xform[0][0] = pOVar6->m_t[0];
                local_1b8.m_xform[0][1] = pOVar6->m_t[1];
                pOVar6 = &local_280;
                if (lVar14 == 0) {
                  pOVar6 = &local_270;
                }
                local_138.m_xform[0][0] = pOVar6->m_t[0];
                local_138.m_xform[0][1] = pOVar6->m_t[1];
                bVar2 = ON_Interval::IsIncreasing(this_00);
                if ((bVar2) &&
                   (bVar2 = ON_Interval::operator!=
                                      ((ON_Interval *)&local_1b8,(ON_Interval *)&local_138), bVar2))
                {
                  bVar2 = ON_Interval::operator==(this_00,(ON_Interval *)&local_1b8);
                  if (bVar2) {
                    this_00->m_t[0] = local_138.m_xform[0][0];
                    this_00->m_t[1] = local_138.m_xform[0][1];
                  }
                  else {
                    pdVar7 = ON_Interval::operator[](this_00,0);
                    dVar16 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_1b8,*pdVar7);
                    local_240 = ON_Interval::ParameterAt((ON_Interval *)&local_138,dVar16);
                    pdVar7 = ON_Interval::operator[](this_00,1);
                    dVar16 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_1b8,*pdVar7);
                    dVar16 = ON_Interval::ParameterAt((ON_Interval *)&local_138,dVar16);
                    ON_Interval::Set(this_00,local_240,dVar16);
                  }
                }
                lVar14 = lVar14 + 0x10;
              } while (lVar14 == 0x10);
            }
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x30);
          lVar8 = 0x30;
          do {
            this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)(local_238.m_xform + -1) + 0x18 + lVar8);
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            lVar8 = lVar8 + -0x10;
          } while (lVar8 != 0);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_BrepFace::SetDomain(
       ON_Interval u_dom,
       ON_Interval v_dom
       )
{
  if ( 0 == m_brep )
    return false;
  if ( !u_dom.IsIncreasing() )
    return false;
  if ( !v_dom.IsIncreasing() )
    return false;
  
  ON_Surface* srf = const_cast<ON_Surface*>(SurfaceOf());
  if ( 0 == srf )
    return false;

  ON_Interval u0_dom = srf->Domain(0);
  ON_Interval v0_dom = srf->Domain(1);
  if ( u0_dom == u_dom && v0_dom == v_dom )
    return true;

  ON_Xform xform(ON_Xform::IdentityTransformation);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

// 2/18/03 GBA.  Destroy cache on the face.
	DestroyRuntimeCache(true);

  if ( m_brep->SurfaceUseCount( m_si, 2 ) > 1 )
  {
    srf = srf->DuplicateSurface();
    m_si = m_brep->AddSurface(srf);
    SetProxySurface(srf);
  }

  if ( u_dom != u0_dom )
  {
    if ( !srf->SetDomain( 0, u_dom ) )
      return false;
  }

  if ( v_dom != v0_dom )
  {
    if ( !srf->SetDomain( 1, v_dom ) )
    {
      srf->SetDomain(0,u0_dom );
      return false;
    }
  }

  // just to be sure 2d curves are in synch with actual surface
  // domain in case srf->SetDomain() does something weird.
  u_dom = srf->Domain(0);
  v_dom = srf->Domain(1);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

  if ( !TransformTrim(xform) )
    return false;

  std::array<std::shared_ptr<const ON_Mesh>, 3> meshes { UniqueMesh(ON::analysis_mesh),  UniqueMesh(ON::render_mesh),  UniqueMesh(ON::preview_mesh) };

  for (auto& m : meshes)
  {
    if (m)
    {
      auto pMesh = const_cast<ON_Mesh*>(m.get());
      for ( int dir = 0; dir < 2; dir++ )
      {
        ON_Interval& mdom = pMesh->m_srf_domain[dir];

        const ON_Interval dom0 = dir ? v0_dom : u0_dom;
        const ON_Interval dom1 = dir ? v_dom : u_dom;

        if ( mdom.IsIncreasing() && dom0 != dom1 )
        {
          if ( mdom == dom0 )
          {
            mdom = dom1;
          }
          else
          {
            double t0 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[0]));
            double t1 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[1]));
            mdom.Set(t0,t1);
          }
        }
      }
    }
  }

  return true;
}